

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_truncated_tree_fix_tree_index_impl.h
# Opt level: O2

double __thiscall
ted::
TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
::tree_dist(TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  longlong *plVar1;
  PostLToDepth *this_00;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  double *pdVar11;
  const_reference pvVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  size_type __n;
  size_t sVar16;
  pointer piVar17;
  size_t sVar18;
  BandMatrix<double> *this_01;
  int iVar19;
  int iVar20;
  size_type __n_00;
  ulong uVar21;
  size_t col;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  uint uVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  double dVar26;
  initializer_list<double> __l;
  vector<int,_std::allocator<int>_> nodes_to_traverse;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  TreeIndexAll *local_90;
  long local_88;
  size_t local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  pointer local_60;
  size_type local_58;
  ulong local_50;
  ulong local_48;
  BandMatrix<double> *local_40;
  size_t local_38;
  
  __n = (size_type)x;
  uVar25 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[__n];
  local_80 = (size_t)(int)uVar25;
  local_88 = (long)y;
  uVar3 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[local_88];
  iVar13 = x - uVar25;
  this_01 = &(this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_;
  local_78 = local_80;
  pdVar11 = data_structures::BandMatrix<double>::at(this_01,0,0);
  *pdVar11 = 0.0;
  uVar8 = e;
  if ((int)uVar3 < e) {
    uVar8 = uVar3;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  uVar21 = (ulong)uVar8;
  sVar16 = 1;
  while (bVar22 = uVar21 != 0, uVar21 = uVar21 - 1, bVar22) {
    pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,0,sVar16 - 1);
    dVar2 = *pdVar11;
    pdVar11 = data_structures::BandMatrix<double>::at(this_01,0,sVar16);
    *pdVar11 = dVar2 + 1.0;
    sVar16 = sVar16 + 1;
  }
  if (e < (int)uVar3) {
    pdVar11 = data_structures::BandMatrix<double>::at(this_01,0,(long)(e + 1));
    *pdVar11 = INFINITY;
  }
  uVar8 = e;
  if ((int)uVar25 < e) {
    uVar8 = uVar25;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  uVar21 = (ulong)uVar8;
  sVar16 = 1;
  while (bVar22 = uVar21 != 0, uVar21 = uVar21 - 1, bVar22) {
    pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,sVar16 - 1,0);
    dVar2 = *pdVar11;
    pdVar11 = data_structures::BandMatrix<double>::at(this_01,sVar16,0);
    *pdVar11 = dVar2 + 1.0;
    sVar16 = sVar16 + 1;
  }
  if (e < (int)uVar25) {
    pdVar11 = data_structures::BandMatrix<double>::at(this_01,(long)(e + 1),0);
    *pdVar11 = INFINITY;
  }
  nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar12 = std::vector<int,_std::allocator<int>_>::at
                      (&(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,__n);
  iVar20 = *pvVar12;
  this_00 = &t1->super_PostLToDepth;
  pvVar12 = std::vector<int,_std::allocator<int>_>::at(&this_00->postl_to_depth_,__n);
  iVar14 = e + 1;
  local_90 = t1;
  if (*pvVar12 + iVar14 < iVar20) {
    pvVar12 = std::vector<int,_std::allocator<int>_>::at(&this_00->postl_to_depth_,__n);
    iVar20 = *pvVar12;
    uVar23 = extraout_XMM0_Dc;
    uVar24 = extraout_XMM0_Dd;
    for (iVar19 = 1; iVar19 <= (int)uVar25; iVar19 = iVar19 + iVar7) {
      __n_00 = (size_type)(int)(iVar13 + (uVar25 - iVar19) + 1);
      pvVar12 = std::vector<int,_std::allocator<int>_>::at(&this_00->postl_to_depth_,__n_00);
      iVar10 = *pvVar12;
      local_c0 = (double)CONCAT44(local_c0._4_4_,(uVar25 - iVar19) + 1);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&nodes_to_traverse,(int *)&local_c0)
      ;
      iVar7 = 1;
      uVar23 = extraout_XMM0_Dc_00;
      uVar24 = extraout_XMM0_Dd_00;
      if (iVar10 == iVar20 + iVar14) {
        pvVar12 = std::vector<int,_std::allocator<int>_>::at
                            (&(t1->super_PostLToSize).postl_to_size_,__n_00);
        iVar7 = *pvVar12;
        uVar23 = extraout_XMM0_Dc_01;
        uVar24 = extraout_XMM0_Dd_01;
      }
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::at
              (&(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,__n);
    uVar23 = extraout_XMM0_Dc_02;
    uVar24 = extraout_XMM0_Dd_02;
    uVar8 = uVar25;
    while( true ) {
      local_c0 = (double)CONCAT44(local_c0._4_4_,uVar8);
      if ((int)uVar8 < 1) break;
      std::vector<int,_std::allocator<int>_>::push_back
                (&nodes_to_traverse,(value_type_conflict3 *)&local_c0);
      uVar8 = local_c0._0_4_ - 1;
      uVar23 = extraout_XMM0_Dc_03;
      uVar24 = extraout_XMM0_Dd_03;
    }
  }
  local_70 = (ulong)(uint)~e;
  local_40 = &(this->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .td_;
  local_68 = (ulong)(iVar13 - 1);
  local_a8._8_4_ = uVar23;
  local_a8._0_8_ = (double)e;
  local_a8._12_4_ = uVar24;
  local_48 = (ulong)(y - uVar3);
  piVar17 = nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (piVar17 ==
        nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      plVar1 = &(this->
                super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ).
                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .subproblem_counter_;
      *plVar1 = *plVar1 + 1;
      sVar16 = local_78 - 1;
      pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,sVar16,(long)(int)uVar3);
      local_c0 = *pdVar11 + 1.0;
      sVar18 = (long)(int)uVar3 - 1;
      pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,local_80,sVar18);
      local_b8 = *pdVar11 + 1.0;
      pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,sVar16,sVar18);
      uVar25 = 0;
      if ((local_90->super_PostLToLabelId).postl_to_label_id_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [__n] != (t2->super_PostLToLabelId).postl_to_label_id_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_88]) {
        uVar25 = 0x3ff00000;
      }
      local_b0 = (double)((ulong)uVar25 << 0x20) + *pdVar11;
      __l._M_len = 3;
      __l._M_array = &local_c0;
      dVar2 = std::min<double>(__l);
      local_a8._8_8_ = ~local_a8._8_8_ & CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_04);
      local_a8._0_8_ =
           ~-(ulong)((double)local_a8._0_8_ < dVar2) & (ulong)dVar2 |
           -(ulong)((double)local_a8._0_8_ < dVar2) & 0x7ff0000000000000;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>);
      return (double)local_a8._0_8_;
    }
    uVar8 = piVar17[-1];
    sVar16 = (size_t)(int)uVar8;
    if ((int)(e - uVar8) < -1) {
      pdVar11 = data_structures::BandMatrix<double>::at
                          (this_01,sVar16,(long)(int)((int)local_70 + uVar8));
      *pdVar11 = INFINITY;
    }
    local_60 = piVar17 + -1;
    sVar18 = (size_t)(uVar8 - e);
    if ((int)(uVar8 - e) < 2) {
      sVar18 = 1;
    }
    uVar9 = uVar8 + e;
    uVar5 = uVar9;
    if ((int)uVar3 < (int)uVar9) {
      uVar5 = uVar3;
    }
    local_38 = (size_t)(int)(uVar8 + iVar13);
    local_58 = (size_type)(int)((int)local_68 + uVar8);
    local_50 = (ulong)(uVar8 - 1);
    iVar20 = ((((x + uVar3) - uVar25) - y) + uVar8) - (int)sVar18;
    while( true ) {
      piVar17 = local_60;
      if (((long)(int)uVar5 < (long)sVar18) || (uVar8 == uVar25 && uVar5 == sVar18)) break;
      plVar1 = &(this->
                super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ).
                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .subproblem_counter_;
      *plVar1 = *plVar1 + 1;
      iVar19 = -iVar20;
      if (0 < iVar20) {
        iVar19 = iVar20;
      }
      if (k < iVar19) {
        pdVar11 = data_structures::BandMatrix<double>::at(this_01,sVar16,sVar18);
LAB_0010b5ec:
        *pdVar11 = INFINITY;
      }
      else {
        pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,sVar16,sVar18 - 1);
        sVar6 = local_38;
        col = (size_t)((int)local_48 + (int)sVar18);
        dVar2 = *pdVar11 + 1.0;
        if (INFINITY <= dVar2) {
          dVar2 = INFINITY;
        }
        pdVar11 = data_structures::BandMatrix<double>::read_at(local_40,local_38,col);
        dVar26 = *pdVar11;
        uVar4 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar6];
        uVar15 = (t2->super_PostLToSize).postl_to_size_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[col];
        if (uVar8 == uVar4) {
          uVar23 = 0;
          uVar24 = 0;
          if (sVar18 != uVar15) goto LAB_0010b4f8;
        }
        else {
LAB_0010b4f8:
          uVar21 = -uVar15 + sVar18;
          iVar19 = ~(e + uVar4) + uVar8;
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          uVar23 = 0;
          uVar24 = 0x7ff00000;
          iVar10 = (int)uVar21;
          if (iVar19 <= iVar10) {
            uVar15 = iVar14 + (uVar8 - uVar4);
            if ((int)uVar3 < (int)uVar15) {
              uVar15 = uVar3;
            }
            uVar23 = 0;
            uVar24 = 0x7ff00000;
            if (iVar10 <= (int)uVar15) {
              pdVar11 = data_structures::BandMatrix<double>::read_at
                                  (this_01,(long)(int)(uVar8 - uVar4),uVar21 & 0xffffffff);
              uVar23 = SUB84(*pdVar11,0);
              uVar24 = (undefined4)((ulong)*pdVar11 >> 0x20);
            }
          }
        }
        dVar26 = dVar26 + (double)CONCAT44(uVar24,uVar23);
        if (dVar2 <= dVar26) {
          dVar26 = dVar2;
        }
        dVar2 = dVar26;
        if ((uVar8 == 1) ||
           ((1 < (int)uVar8 &&
            (pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                 (&this_00->postl_to_depth_,local_58),
            *pvVar12 -
            (this_00->postl_to_depth_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[__n] <= iVar14)))) {
          pdVar11 = data_structures::BandMatrix<double>::read_at(this_01,local_50,sVar18);
          dVar2 = *pdVar11 + 1.0;
          if (dVar26 <= *pdVar11 + 1.0) {
            dVar2 = dVar26;
          }
        }
        if ((double)local_a8._0_8_ < dVar2) {
          pdVar11 = data_structures::BandMatrix<double>::at(this_01,sVar16,sVar18);
          goto LAB_0010b5ec;
        }
        pdVar11 = data_structures::BandMatrix<double>::at(this_01,sVar16,sVar18);
        *pdVar11 = dVar2;
      }
      sVar18 = sVar18 + 1;
      iVar20 = iVar20 + -1;
    }
    if ((int)uVar9 < (int)uVar3) {
      pdVar11 = data_structures::BandMatrix<double>::at(this_01,sVar16,(long)(int)(uVar9 + 1));
      *pdVar11 = INFINITY;
    }
  } while( true );
}

Assistant:

double TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];

  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = 0;

  // Collect all nodes in truncated tree to traverse.
  std::vector<int> nodes_to_traverse; // Normalized to current subtree: 1..|x|.
  // NOTE: If we can't truncate anything, all the nodes from the subtree have
  //       to be traversed.
  if (t1.postl_to_subtree_max_depth_.at(x) <= t1.postl_to_depth_.at(x) + e + 1) {
    max_depth = t1.postl_to_subtree_max_depth_.at(x);
    for (int n = x_size; n >= 1; --n) {
      nodes_to_traverse.push_back(n);
    }
  } else {
    max_depth = t1.postl_to_depth_.at(x) + e + 1;
    int n = 1;
    int post_n = 0;
    int depth_n = 0;
    while (n <= x_size) { // Loop in right-to-left-preorder
      post_n = x_size - n + 1 + x_off;
      depth_n = t1.postl_to_depth_.at(post_n);
      // if (depth_n <= max_depth) { // NOTE: depth_n < max_depth is always satisfied.
        nodes_to_traverse.push_back(x_size - n + 1);
        if (depth_n == max_depth) {// Jump to the next node to the left with the max_depth.
          n += t1.postl_to_size_.at(post_n);
        } else {
          ++n;
        }
      // }
    }
  }

  // Traversing truncated tree to filter out i-values based on depth.
  typename std::vector<int>::reverse_iterator rit = nodes_to_traverse.rbegin();
  int i;
  for (; rit != nodes_to_traverse.rend(); ++rit) {
    i = *rit;
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
  }

  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}